

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void * parse_else(Parser *parser)

{
  List *list;
  void *pvVar1;
  BlockStmt *block_00;
  List *block;
  Parser *parser_local;
  
  expect(parser,ELSE);
  if (parser->token->kind == IF) {
    list = new_list();
    pvVar1 = parse_if(parser);
    list_add(list,pvVar1);
    block_00 = new_block_stmt(list);
    parser_local = (Parser *)new_else_stmt(block_00);
  }
  else {
    pvVar1 = parse_block(parser);
    parser_local = (Parser *)new_else_stmt(pvVar1);
  }
  return parser_local;
}

Assistant:

void *parse_else(Parser *parser) {
    expect(parser, ELSE);
    if (token(parser)->kind == IF) {
        /**
         * if(expr){                 if(expr){
         *
         *
         * }else if(expr){   ==>     }else{
         *                               if(expr){
         *
         *                               }
         * }                         }
         *
         *
         */
        List* block = new_list();
        list_add(block, parse_if(parser));
        return new_else_stmt(new_block_stmt(block));
    }
    return new_else_stmt(parse_block(parser));
}